

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O1

void create_file(char *name)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uv_loop_t *puVar4;
  uv_loop_t *puVar5;
  uv_handle_t *unaff_RBX;
  uv_fs_t *handle;
  uv_fs_t *puVar6;
  uv_handle_t *handle_00;
  uv_fs_t *unaff_R14;
  uv_fs_t req;
  uv_work_t uStackY_798;
  uv_loop_t *puStackY_718;
  uv_loop_t uStackY_710;
  uv_handle_t *puStackY_3c0;
  uv_buf_t uStack_3a8;
  uv_fs_t uStack_398;
  uv_handle_t *puStack_1e0;
  code *pcStack_1d8;
  uv_handle_t *puStack_1d0;
  uv_fs_t uStack_1c8;
  
  handle = &uStack_1c8;
  puVar6 = &uStack_1c8;
  handle_00 = (uv_handle_t *)0x0;
  iVar3 = 0x41;
  puStack_1d0 = (uv_handle_t *)0x155c4d;
  uVar1 = uv_fs_open((uv_loop_t *)0x0,&uStack_1c8,"watch_file",0x41,0x180,(uv_fs_cb)0x0);
  if ((int)uVar1 < 0) {
    puStack_1d0 = (uv_handle_t *)0x155c88;
    create_file_cold_1();
  }
  else {
    unaff_RBX = (uv_handle_t *)(ulong)uVar1;
    puStack_1d0 = (uv_handle_t *)0x155c5e;
    uv_fs_req_cleanup(&uStack_1c8);
    handle_00 = (uv_handle_t *)0x0;
    iVar3 = 0;
    puStack_1d0 = (uv_handle_t *)0x155c6c;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&uStack_1c8,uVar1,(uv_fs_cb)0x0);
    handle = puVar6;
    unaff_R14 = &uStack_1c8;
    if (iVar2 == 0) {
      puStack_1d0 = (uv_handle_t *)0x155c78;
      uv_fs_req_cleanup(&uStack_1c8);
      return;
    }
  }
  puStack_1d0 = (uv_handle_t *)fs_event_cb_file_current_dir;
  create_file_cold_2();
  puStack_1d0 = unaff_RBX;
  if (fs_event_cb_called == '\x01') {
    pcStack_1d8 = (code *)0x155ccb;
    fs_event_cb_file_current_dir_cold_3();
LAB_00155ccb:
    handle = (uv_fs_t *)handle_00;
    pcStack_1d8 = (code *)0x155cd0;
    fs_event_cb_file_current_dir_cold_1();
  }
  else {
    fs_event_cb_called = '\x01';
    if (iVar3 != 0) goto LAB_00155ccb;
    pcStack_1d8 = (code *)0x155cb7;
    iVar3 = strcmp((char *)handle,"watch_file");
    unaff_RBX = handle_00;
    if (iVar3 == 0) {
      uv_close(handle_00,(uv_close_cb)0x0);
      return;
    }
  }
  pcStack_1d8 = timer_cb_touch;
  fs_event_cb_file_current_dir_cold_2();
  puStackY_3c0 = (uv_handle_t *)0x155ce6;
  puStack_1e0 = unaff_RBX;
  pcStack_1d8 = (code *)unaff_R14;
  uv_close((uv_handle_t *)handle,(uv_close_cb)0x0);
  puStackY_3c0 = (uv_handle_t *)0x155d04;
  uVar1 = uv_fs_open((uv_loop_t *)0x0,&uStack_398,"watch_file",2,0,(uv_fs_cb)0x0);
  if ((int)uVar1 < 0) {
    puStackY_3c0 = (uv_handle_t *)0x155d9c;
    timer_cb_touch_cold_1();
LAB_00155d9c:
    puStackY_3c0 = (uv_handle_t *)0x155da1;
    timer_cb_touch_cold_2();
  }
  else {
    unaff_RBX = (uv_handle_t *)(ulong)uVar1;
    puStackY_3c0 = (uv_handle_t *)0x155d1b;
    uv_fs_req_cleanup(&uStack_398);
    puStackY_3c0 = (uv_handle_t *)0x155d2c;
    uStack_3a8 = uv_buf_init("foo",4);
    puStackY_3c0 = (uv_handle_t *)0x155d59;
    iVar3 = uv_fs_write((uv_loop_t *)0x0,&uStack_398,uVar1,&uStack_3a8,1,-1,(uv_fs_cb)0x0);
    if (iVar3 < 0) goto LAB_00155d9c;
    puStackY_3c0 = (uv_handle_t *)0x155d6a;
    uv_fs_req_cleanup(&uStack_398);
    puStackY_3c0 = (uv_handle_t *)0x155d78;
    iVar3 = uv_fs_close((uv_loop_t *)0x0,&uStack_398,uVar1,(uv_fs_cb)0x0);
    if (iVar3 == 0) {
      puStackY_3c0 = (uv_handle_t *)0x155d86;
      uv_fs_req_cleanup(&uStack_398);
      timer_cb_touch_called = timer_cb_touch_called + 1;
      return;
    }
  }
  puStackY_3c0 = (uv_handle_t *)run_test_fork_threadpool_queue_work_simple;
  timer_cb_touch_cold_3();
  puVar5 = &uStackY_710;
  puStackY_718 = (uv_loop_t *)0x155db3;
  puStackY_3c0 = unaff_RBX;
  puVar4 = uv_default_loop();
  puStackY_718 = (uv_loop_t *)0x155dbb;
  assert_run_work(puVar4);
  puStackY_718 = (uv_loop_t *)0x155dc0;
  uVar1 = fork();
  if (uVar1 == 0) {
    puStackY_718 = (uv_loop_t *)0x155dea;
    getpid();
    puStackY_718 = (uv_loop_t *)0x155dfa;
    printf("Running child in %d\n");
    puStackY_718 = (uv_loop_t *)0x155e05;
    uv_loop_init(&uStackY_710);
    puStackY_718 = (uv_loop_t *)0x155e11;
    puts("Child first watch");
    puStackY_718 = (uv_loop_t *)0x155e19;
    assert_run_work(&uStackY_710);
    puStackY_718 = (uv_loop_t *)0x155e21;
    uv_loop_close(&uStackY_710);
    puStackY_718 = (uv_loop_t *)0x155e2d;
    puts("Child second watch default loop");
    puStackY_718 = (uv_loop_t *)0x155e32;
    puVar4 = uv_default_loop();
    puStackY_718 = (uv_loop_t *)0x155e3a;
    iVar3 = uv_loop_fork(puVar4);
    if (iVar3 == 0) {
      puStackY_718 = (uv_loop_t *)0x155e43;
      puVar4 = uv_default_loop();
      puStackY_718 = (uv_loop_t *)0x155e4b;
      assert_run_work(puVar4);
      puStackY_718 = (uv_loop_t *)0x155e57;
      puts("Exiting child ");
      goto LAB_00155e57;
    }
  }
  else {
    puVar5 = (uv_loop_t *)(ulong)uVar1;
    if (uVar1 != 0xffffffff) {
      puStackY_718 = (uv_loop_t *)0x155dd4;
      puVar4 = uv_default_loop();
      puStackY_718 = (uv_loop_t *)0x155ddc;
      assert_run_work(puVar4);
      puStackY_718 = (uv_loop_t *)0x155de3;
      assert_wait_child(uVar1);
LAB_00155e57:
      puStackY_718 = (uv_loop_t *)0x155e5c;
      puVar5 = uv_default_loop();
      puStackY_718 = (uv_loop_t *)0x155e70;
      uv_walk(puVar5,close_walk_cb,(void *)0x0);
      puStackY_718 = (uv_loop_t *)0x155e7a;
      uv_run(puVar5,UV_RUN_DEFAULT);
      puStackY_718 = (uv_loop_t *)0x155e7f;
      puVar4 = uv_default_loop();
      puStackY_718 = (uv_loop_t *)0x155e87;
      iVar3 = uv_loop_close(puVar4);
      if (iVar3 == 0) {
        puStackY_718 = (uv_loop_t *)0x155e90;
        uv_library_shutdown();
        return;
      }
      puStackY_718 = (uv_loop_t *)0x155ea0;
      run_test_fork_threadpool_queue_work_simple_cold_3();
    }
    puStackY_718 = (uv_loop_t *)0x155ea5;
    run_test_fork_threadpool_queue_work_simple_cold_2();
  }
  puStackY_718 = (uv_loop_t *)assert_run_work;
  run_test_fork_threadpool_queue_work_simple_cold_1();
  puStackY_718 = puVar5;
  if (work_cb_count == 0) {
    if (after_work_cb_count != 0) goto LAB_00155f4e;
    uVar1 = getpid();
    printf("Queue in %d\n",(ulong)uVar1);
    puVar5 = puVar4;
    iVar3 = uv_queue_work(puVar4,&uStackY_798,work_cb,after_work_cb);
    if (iVar3 != 0) goto LAB_00155f53;
    getpid();
    printf("Running in %d\n");
    uv_run(puVar4,UV_RUN_DEFAULT);
    if (work_cb_count == 1) {
      if (after_work_cb_count == 1) {
        work_cb_count = 0;
        after_work_cb_count = 0;
        return;
      }
      goto LAB_00155f5d;
    }
  }
  else {
    assert_run_work_cold_1();
LAB_00155f4e:
    assert_run_work_cold_2();
    puVar5 = puVar4;
LAB_00155f53:
    puVar4 = puVar5;
    assert_run_work_cold_3();
  }
  assert_run_work_cold_4();
LAB_00155f5d:
  assert_run_work_cold_5();
  timer_cb_called = timer_cb_called + 1;
  uv_close((uv_handle_t *)puVar4,(uv_close_cb)0x0);
  return;
}

Assistant:

static void create_file(const char* name) {
  int r;
  uv_file file;
  uv_fs_t req;

  r = uv_fs_open(NULL, &req, name, O_WRONLY | O_CREAT, S_IWUSR | S_IRUSR, NULL);
  ASSERT(r >= 0);
  file = r;
  uv_fs_req_cleanup(&req);
  r = uv_fs_close(NULL, &req, file, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&req);
}